

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::PreWriteBlock(Cluster *this)

{
  long in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    if (((*(byte *)(in_RDI + 6) & 1) != 0) ||
       (bVar1 = WriteClusterHeader((Cluster *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
       bVar1)) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Cluster::PreWriteBlock() {
  if (finalized_)
    return false;

  if (!header_written_) {
    if (!WriteClusterHeader())
      return false;
  }

  return true;
}